

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cpp
# Opt level: O0

Pattern * __thiscall
compile_template<AST::DirectionAlternation>::operator()
          (compile_template<AST::DirectionAlternation> *this,Pattern *p)

{
  Pattern *pPVar1;
  Pattern *p_local;
  compile_template<AST::DirectionAlternation> *this_local;
  
  pPVar1 = compile((DirectionAlternation *)p);
  return pPVar1;
}

Assistant:

Pattern* operator()(AST::Pattern* p) {
        return compile((PClass*)p);
    }